

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest::SetUp
          (MergedDescriptorDatabaseTest *this)

{
  AddToDatabase(&this->database1_,
                "name: \"foo.proto\" message_type { name:\"Foo\" extension_range { start: 1 end: 100 } } extension { name:\"foo_ext\" extendee: \".Foo\" number:3             label:LABEL_OPTIONAL type:TYPE_INT32 } "
               );
  AddToDatabase(&this->database2_,
                "name: \"bar.proto\" message_type { name:\"Bar\" extension_range { start: 1 end: 100 } } extension { name:\"bar_ext\" extendee: \".Bar\" number:5             label:LABEL_OPTIONAL type:TYPE_INT32 } "
               );
  AddToDatabase(&this->database1_,
                "name: \"baz.proto\" message_type { name:\"Baz\" extension_range { start: 1 end: 100 } } message_type { name:\"FromPool1\" } extension { name:\"baz_ext\" extendee: \".Baz\" number:12             label:LABEL_OPTIONAL type:TYPE_INT32 } extension { name:\"database1_only_ext\" extendee: \".Baz\" number:13             label:LABEL_OPTIONAL type:TYPE_INT32 } "
               );
  AddToDatabase(&this->database2_,
                "name: \"baz.proto\" message_type { name:\"Baz\" extension_range { start: 1 end: 100 } } message_type { name:\"FromPool2\" } extension { name:\"baz_ext\" extendee: \".Baz\" number:12             label:LABEL_OPTIONAL type:TYPE_INT32 } "
               );
  return;
}

Assistant:

void SetUp() override {
    AddToDatabase(
        &database1_,
        "name: \"foo.proto\" "
        "message_type { name:\"Foo\" extension_range { start: 1 end: 100 } } "
        "extension { name:\"foo_ext\" extendee: \".Foo\" number:3 "
        "            label:LABEL_OPTIONAL type:TYPE_INT32 } ");
    AddToDatabase(
        &database2_,
        "name: \"bar.proto\" "
        "message_type { name:\"Bar\" extension_range { start: 1 end: 100 } } "
        "extension { name:\"bar_ext\" extendee: \".Bar\" number:5 "
        "            label:LABEL_OPTIONAL type:TYPE_INT32 } ");

    // baz.proto exists in both pools, with different definitions.
    AddToDatabase(
        &database1_,
        "name: \"baz.proto\" "
        "message_type { name:\"Baz\" extension_range { start: 1 end: 100 } } "
        "message_type { name:\"FromPool1\" } "
        "extension { name:\"baz_ext\" extendee: \".Baz\" number:12 "
        "            label:LABEL_OPTIONAL type:TYPE_INT32 } "
        "extension { name:\"database1_only_ext\" extendee: \".Baz\" number:13 "
        "            label:LABEL_OPTIONAL type:TYPE_INT32 } ");
    AddToDatabase(
        &database2_,
        "name: \"baz.proto\" "
        "message_type { name:\"Baz\" extension_range { start: 1 end: 100 } } "
        "message_type { name:\"FromPool2\" } "
        "extension { name:\"baz_ext\" extendee: \".Baz\" number:12 "
        "            label:LABEL_OPTIONAL type:TYPE_INT32 } ");
  }